

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngmem.c
# Opt level: O0

png_voidp png_malloc_array_checked(png_const_structrp png_ptr,int nelements,size_t element_size)

{
  undefined1 auVar1 [16];
  png_alloc_size_t req;
  size_t element_size_local;
  int nelements_local;
  png_const_structrp png_ptr_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = element_size;
  if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) < (ulong)(long)nelements
     ) {
    png_ptr_local = (png_const_structrp)0x0;
  }
  else {
    png_ptr_local = (png_const_structrp)png_malloc_base(png_ptr,(long)nelements * element_size);
  }
  return png_ptr_local;
}

Assistant:

static png_voidp
png_malloc_array_checked(png_const_structrp png_ptr, int nelements,
    size_t element_size)
{
   png_alloc_size_t req = (png_alloc_size_t)nelements; /* known to be > 0 */

   if (req <= PNG_SIZE_MAX/element_size)
      return png_malloc_base(png_ptr, req * element_size);

   /* The failure case when the request is too large */
   return NULL;
}